

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_function.h
# Opt level: O2

value * __thiscall
mjs::gc_function::
impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/error_object.cpp:108:50)>
::call(value *__return_storage_ptr__,
      impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_mras0[P]mjs_src_mjs_error_object_cpp:108:50)>
      *this,value *this_,vector<mjs::value,_std::allocator<mjs::value>_> *args)

{
  gc_heap_ptr<mjs::global_object> *this_00;
  gc_heap *h;
  pointer pvVar1;
  void *pvVar2;
  global_object *this_01;
  long *plVar3;
  long *plVar4;
  gc_heap_ptr_untyped gStack_88;
  wstring_view local_78;
  gc_heap_ptr<mjs::error_object> eo;
  value local_58;
  
  this_00 = &(this->f).global;
  pvVar2 = gc_heap_ptr_untyped::get(&this_00->super_gc_heap_ptr_untyped);
  h = *(gc_heap **)((long)pvVar2 + 8);
  this_01 = (global_object *)gc_heap_ptr_untyped::get(&this_00->super_gc_heap_ptr_untyped);
  global_object::stack_trace_abi_cxx11_((wstring *)&local_58,this_01);
  local_78._M_len = (size_t)local_58.field_1.n_;
  local_78._M_str = (wchar_t *)local_58._0_8_;
  string::string((string *)&gStack_88,h,&local_78);
  gc_heap::
  make<mjs::error_object,mjs::native_error_type_const&,mjs::string_const&,mjs::gc_heap_ptr<mjs::object>const&,mjs::string>
            ((gc_heap *)&eo,(native_error_type *)h,(string *)&this->f,
             (gc_heap_ptr<mjs::object> *)&(this->f).n,(string *)&(this->f).prototype);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&gStack_88);
  std::__cxx11::wstring::~wstring((wstring *)&local_58);
  pvVar1 = (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((pvVar1 != (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
                 super__Vector_impl_data._M_finish) && (pvVar1->type_ != undefined)) {
    plVar3 = (long *)gc_heap_ptr_untyped::get(&eo.super_gc_heap_ptr_untyped);
    plVar4 = (long *)gc_heap_ptr_untyped::get(&this_00->super_gc_heap_ptr_untyped);
    (**(code **)(*plVar4 + 0x98))(&gStack_88,plVar4,"message");
    to_string((mjs *)&local_78,h,
              (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
              super__Vector_impl_data._M_start);
    value::value(&local_58,(string *)&local_78);
    (**(code **)(*plVar3 + 8))(plVar3,&gStack_88,&local_58,6);
    value::~value(&local_58);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_78);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&gStack_88);
  }
  gc_heap_ptr_untyped::gc_heap_ptr_untyped
            ((gc_heap_ptr_untyped *)&local_58,&eo.super_gc_heap_ptr_untyped);
  value::value(__return_storage_ptr__,(object_ptr *)&local_58);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_58);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&eo.super_gc_heap_ptr_untyped);
  return __return_storage_ptr__;
}

Assistant:

value call(const value& this_, const std::vector<value>& args) override { return f(this_, args); }